

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asn1parse.cpp
# Opt level: O0

int mbedtls_asn1_traverse_sequence_of
              (uchar **p,uchar *end,uchar tag_must_mask,uchar tag_must_val,uchar tag_may_mask,
              uchar tag_may_val,_func_int_void_ptr_int_uchar_ptr_size_t *cb,void *ctx)

{
  byte bVar1;
  byte *pbVar2;
  int iVar3;
  undefined4 in_ECX;
  undefined4 in_EDX;
  uchar **in_RSI;
  uchar **in_RDI;
  undefined4 in_R8D;
  byte in_R9B;
  code *in_stack_00000008;
  undefined8 in_stack_00000010;
  uchar tag;
  size_t len;
  int ret;
  undefined4 in_stack_ffffffffffffffb8;
  size_t local_28;
  int local_20;
  byte local_1c;
  byte local_1b;
  byte local_1a;
  byte local_19;
  uchar **local_18;
  uchar **local_10;
  int local_4;
  
  local_19 = (byte)in_EDX;
  local_1a = (byte)in_ECX;
  local_1b = (byte)in_R8D;
  local_1c = in_R9B;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_4 = mbedtls_asn1_get_tag
                      (in_RSI,(uchar *)CONCAT44(in_EDX,in_ECX),
                       (size_t *)CONCAT44(in_R8D,in_stack_ffffffffffffffb8),0);
  if (local_4 == 0) {
    if ((uchar **)(*local_10 + local_28) == local_18) {
      while (local_20 = 0, *local_10 < local_18) {
        pbVar2 = *local_10;
        *local_10 = pbVar2 + 1;
        bVar1 = *pbVar2;
        if ((bVar1 & local_19) != local_1a) {
          return -0x62;
        }
        local_20 = mbedtls_asn1_get_len(local_10,(uchar *)local_18,&local_28);
        if (local_20 != 0) {
          return local_20;
        }
        if ((((bVar1 & local_1b) == local_1c) && (in_stack_00000008 != (code *)0x0)) &&
           (iVar3 = (*in_stack_00000008)(in_stack_00000010,bVar1,*local_10,local_28), iVar3 != 0)) {
          return iVar3;
        }
        *local_10 = *local_10 + local_28;
      }
      local_4 = 0;
    }
    else {
      local_4 = -0x66;
    }
  }
  return local_4;
}

Assistant:

int mbedtls_asn1_traverse_sequence_of(
    unsigned char **p,
    const unsigned char *end,
    unsigned char tag_must_mask, unsigned char tag_must_val,
    unsigned char tag_may_mask, unsigned char tag_may_val,
    int (*cb)(void *ctx, int tag,
              unsigned char *start, size_t len),
    void *ctx)
{
    int ret;
    size_t len;

    /* Get main sequence tag */
    if ((ret = mbedtls_asn1_get_tag(p, end, &len,
                                    MBEDTLS_ASN1_CONSTRUCTED | MBEDTLS_ASN1_SEQUENCE)) != 0) {
        return ret;
    }

    if (*p + len != end) {
        return MBEDTLS_ERR_ASN1_LENGTH_MISMATCH;
    }

    while (*p < end) {
        unsigned char const tag = *(*p)++;

        if ((tag & tag_must_mask) != tag_must_val) {
            return MBEDTLS_ERR_ASN1_UNEXPECTED_TAG;
        }

        if ((ret = mbedtls_asn1_get_len(p, end, &len)) != 0) {
            return ret;
        }

        if ((tag & tag_may_mask) == tag_may_val) {
            if (cb != NULL) {
                ret = cb(ctx, tag, *p, len);
                if (ret != 0) {
                    return ret;
                }
            }
        }

        *p += len;
    }

    return 0;
}